

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O1

token_type __thiscall
nlohmann::detail::
lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
::scan_literal(lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
               *this,char *literal_text,size_t length,token_type return_type)

{
  int_type iVar1;
  size_t sVar2;
  
  if (this->current != (int)*literal_text) {
    __assert_fail("current == literal_text[0]",
                  "/workspace/llm4binary/github/license_c_cmakelists/abedra[P]libvault/lib/json.hpp"
                  ,0x1a33,
                  "token_type nlohmann::detail::lexer<nlohmann::basic_json<>>::scan_literal(const char *, const std::size_t, token_type) [BasicJsonType = nlohmann::basic_json<>]"
                 );
  }
  if (1 < length) {
    sVar2 = 1;
    do {
      iVar1 = get(this);
      if (iVar1 != literal_text[sVar2]) {
        this->error_message = "invalid literal";
        return parse_error;
      }
      sVar2 = sVar2 + 1;
    } while (length != sVar2);
  }
  return return_type;
}

Assistant:

token_type scan_literal(const char* literal_text, const std::size_t length,
                            token_type return_type)
    {
        assert(current == literal_text[0]);
        for (std::size_t i = 1; i < length; ++i)
        {
            if (JSON_UNLIKELY(get() != literal_text[i]))
            {
                error_message = "invalid literal";
                return token_type::parse_error;
            }
        }
        return return_type;
    }